

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logs.c
# Opt level: O2

void lwsl_emit_stderr_notimestamp(int level,char *line)

{
  int iVar1;
  char **ppcVar2;
  uint uVar3;
  
  if (tty == '\0') {
    iVar1 = isatty(2);
    tty = (byte)iVar1 | 2;
  }
  if (tty == '\x03') {
    ppcVar2 = colours + 0xb;
    for (uVar3 = 0x800; (uVar3 != 0 && ((uVar3 & level) == 0)); uVar3 = uVar3 >> 1) {
      ppcVar2 = ppcVar2 + -1;
    }
    fprintf(_stderr,"%c%s%s%c[0m",0x1b,*ppcVar2,line,0x1b);
    return;
  }
  fputs(line,_stderr);
  return;
}

Assistant:

void
lwsl_emit_stderr_notimestamp(int level, const char *line)
{
	int n, m = LWS_ARRAY_SIZE(colours) - 1;

	if (!tty)
		tty = isatty(2) | 2;

	if (tty == 3) {
		n = 1 << (LWS_ARRAY_SIZE(colours) - 1);
		while (n) {
			if (level & n)
				break;
			m--;
			n >>= 1;
		}
		fprintf(stderr, "%c%s%s%c[0m", 27, colours[m], line, 27);
	} else
		fprintf(stderr, "%s", line);
}